

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_soc.cpp
# Opt level: O0

RK_U32 mpp_check_soc_cap(MppCtxType type,MppCodingType coding)

{
  MppSocService *pMVar1;
  RK_U32 local_18;
  RK_U32 cap;
  MppCodingType coding_local;
  MppCtxType type_local;
  
  if (type == MPP_CTX_DEC) {
    pMVar1 = MppSocService::get();
    local_18 = MppSocService::get_dec_cap(pMVar1);
  }
  else {
    if (type != MPP_CTX_ENC) {
      return 0;
    }
    pMVar1 = MppSocService::get();
    local_18 = MppSocService::get_enc_cap(pMVar1);
  }
  if (local_18 == 0) {
    coding_local = MPP_VIDEO_CodingUnused;
  }
  else {
    coding_local = is_valid_cap_coding(local_18,coding);
  }
  return coding_local;
}

Assistant:

RK_U32 mpp_check_soc_cap(MppCtxType type, MppCodingType coding)
{
    RK_U32 cap = 0;

    if (type == MPP_CTX_DEC)
        cap = MppSocService::get()->get_dec_cap();
    else if (type == MPP_CTX_ENC)
        cap = MppSocService::get()->get_enc_cap();
    else
        return 0;

    if (!cap)
        return 0;

    return is_valid_cap_coding(cap, coding);
}